

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O0

MPP_RET __thiscall Mpp::notify(Mpp *this,MppBufferGroup group)

{
  MPP_RET local_1c;
  MPP_RET ret;
  MppBufferGroup group_local;
  Mpp *this_local;
  
  local_1c = MPP_NOK;
  if ((this->mType == MPP_CTX_DEC) && (group == this->mFrameGroup)) {
    local_1c = notify(this,0x440);
  }
  return local_1c;
}

Assistant:

MPP_RET Mpp::notify(MppBufferGroup group)
{
    MPP_RET ret = MPP_NOK;

    switch (mType) {
    case MPP_CTX_DEC : {
        if (group == mFrameGroup)
            ret = notify(MPP_DEC_NOTIFY_BUFFER_VALID |
                         MPP_DEC_NOTIFY_BUFFER_MATCH);
    } break;
    default : {
    } break;
    }

    return ret;
}